

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall Parser::match(Parser *this,token t)

{
  DatalogProgram *this_00;
  runtime_error *this_01;
  tok *ptVar1;
  string local_40;
  
  if ((this->curr).t != t) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"Tokens don\'t match.");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (t == STRING) {
    this_00 = this->prog;
    std::__cxx11::string::string((string *)&local_40,(string *)&(this->curr).s);
    DatalogProgram::add_dom_str(this_00,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    ptVar1 = (this->it)._M_current + 1;
    (this->it)._M_current = ptVar1;
  }
  else {
    ptVar1 = (this->it)._M_current + 1;
    (this->it)._M_current = ptVar1;
    if (t == END_FILE) {
      return;
    }
  }
  if (ptVar1 != (this->toks).super__Vector_base<tok,_std::allocator<tok>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    tok::operator=(&this->curr,ptVar1);
  }
  return;
}

Assistant:

void Parser::match(token t)
{
//	print_tok(curr,cout);
//	cout << s->tok_string(t) << endl;
	if (t != curr.t) throw runtime_error("Tokens don't match.");
	if (t == STRING) prog->add_dom_str(curr.s);
	it++;
	if (t==END_FILE || it == toks.end()) return;
	curr = *it;
}